

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O0

void Gia_ManCollectTfo(Gia_Man_t *p,Vec_Int_t *vRoots,Vec_Int_t *vNodes)

{
  int iVar1;
  undefined4 local_24;
  int iRoot;
  int i;
  Vec_Int_t *vNodes_local;
  Vec_Int_t *vRoots_local;
  Gia_Man_t *p_local;
  
  Vec_IntClear(vNodes);
  Gia_ManIncrementTravId(p);
  for (local_24 = 0; iVar1 = Vec_IntSize(vRoots), local_24 < iVar1; local_24 = local_24 + 1) {
    iVar1 = Vec_IntEntry(vRoots,local_24);
    Gia_ManCollectTfo_rec(p,iVar1,vNodes);
  }
  return;
}

Assistant:

void Gia_ManCollectTfo( Gia_Man_t * p, Vec_Int_t * vRoots, Vec_Int_t * vNodes )
{
    int i, iRoot; 
    Vec_IntClear( vNodes );
    Gia_ManIncrementTravId( p );
    Vec_IntForEachEntry( vRoots, iRoot, i )
        Gia_ManCollectTfo_rec( p, iRoot, vNodes );
}